

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O3

vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> * __thiscall
xmrig::CudaConfig::get
          (vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>
           *__return_storage_ptr__,CudaConfig *this,Miner *miner,
          vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *devices)

{
  pointer pCVar1;
  pointer pCVar2;
  CudaThread *pCVar3;
  pointer pCVar4;
  mapped_type *pmVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  CudaThread *__args_1;
  Miner *local_48;
  String local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = miner;
  String::String(&local_40,"cn/blur");
  pmVar5 = std::
           map<xmrig::String,_xmrig::CudaThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
           ::at(&(this->m_threads).m_profiles,&local_40);
  if (local_40.m_data != (char *)0x0) {
    operator_delete__(local_40.m_data);
  }
  pCVar1 = (pmVar5->m_data).
           super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (pmVar5->m_data).
           super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar1 != pCVar2) {
    std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::reserve
              (__return_storage_ptr__,(long)pCVar2 - (long)pCVar1 >> 5);
    pCVar3 = (pmVar5->m_data).
             super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__args_1 = (pmVar5->m_data).
                    super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
                    _M_impl.super__Vector_impl_data._M_start; __args_1 != pCVar3;
        __args_1 = __args_1 + 1) {
      pCVar4 = (devices->super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(devices->
                    super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pCVar4;
      if (lVar6 != 0) {
        uVar7 = (lVar6 >> 4) * -0x5555555555555555;
        uVar9 = 1;
        uVar10 = 0;
        do {
          if (pCVar4[uVar10].m_index == __args_1->m_index) {
            if (uVar9 != 0) {
              std::vector<xmrig::CudaLaunchData,std::allocator<xmrig::CudaLaunchData>>::
              emplace_back<xmrig::Miner_const*&,xmrig::CudaThread_const&,xmrig::CudaDevice_const&>
                        ((vector<xmrig::CudaLaunchData,std::allocator<xmrig::CudaLaunchData>> *)
                         __return_storage_ptr__,&local_48,__args_1,pCVar4 + (int)(uVar9 - 1));
              goto LAB_0016a7ac;
            }
            break;
          }
          uVar10 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
      }
      pcVar8 = cuda_tag();
      Log::print(INFO,"%s\x1b[0;33m skip non-existing device with index \x1b[0m\x1b[1;33m%u\x1b[0m",
                 pcVar8,(ulong)__args_1->m_index);
LAB_0016a7ac:
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<xmrig::CudaLaunchData> xmrig::CudaConfig::get(const Miner *miner, const std::vector<CudaDevice> &devices) const
{
    auto deviceIndex = [&devices](uint32_t index) -> int {
        for (uint32_t i = 0; i < devices.size(); ++i) {
            if (devices[i].index() == index) {
                return i;
            }
        }

        return -1;
    };

    std::vector<CudaLaunchData> out;
    const auto &threads = m_threads.get();

    if (threads.isEmpty()) {
        return out;
    }

    out.reserve(threads.count());

    for (const auto &thread : threads.data()) {
        const int index = deviceIndex(thread.index());
        if (index == -1) {
            LOG_INFO("%s" YELLOW(" skip non-existing device with index ") YELLOW_BOLD("%u"), cuda_tag(), thread.index());
            continue;
        }

        out.emplace_back(miner, thread, devices[static_cast<size_t>(index)]);
    }

    return out;
}